

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O3

void __thiscall FEventTree::~FEventTree(FEventTree *this)

{
  FEvent *pFVar1;
  FEvent *pFVar2;
  
  DeletionTraverser(this,this->Root);
  this->Root = &this->Nil;
  pFVar2 = this->Spare;
  while (pFVar2 != (FEvent *)0x0) {
    pFVar1 = pFVar2->Left;
    operator_delete(pFVar2,0x28);
    pFVar2 = pFVar1;
  }
  return;
}

Assistant:

FEventTree::~FEventTree ()
{
	FEvent *probe;

	DeleteAll ();
	probe = Spare;
	while (probe != NULL)
	{
		FEvent *next = probe->Left;
		delete probe;
		probe = next;
	}
}